

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorInitializer.cxx
# Opt level: O0

string * GetAutogenTargetBuildDir_abi_cxx11_
                   (string *__return_storage_ptr__,cmGeneratorTarget *target)

{
  ulong uVar1;
  char *pcVar2;
  string local_58;
  cmMakefile *local_28;
  cmMakefile *makefile;
  cmGeneratorTarget *local_18;
  cmGeneratorTarget *target_local;
  string *targetDir;
  
  makefile._7_1_ = 0;
  local_18 = target;
  target_local = (cmGeneratorTarget *)__return_storage_ptr__;
  GetSafeProperty_abi_cxx11_(__return_storage_ptr__,target,"AUTOGEN_BUILD_DIR");
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    local_28 = cmTarget::GetMakefile(local_18->Target);
    pcVar2 = cmMakefile::GetCurrentBinaryDirectory(local_28);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,pcVar2);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
    GetAutogenTargetName_abi_cxx11_(&local_58,local_18);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string GetAutogenTargetBuildDir(cmGeneratorTarget const* target)
{
  std::string targetDir = GetSafeProperty(target, "AUTOGEN_BUILD_DIR");
  if (targetDir.empty()) {
    cmMakefile* makefile = target->Target->GetMakefile();
    targetDir = makefile->GetCurrentBinaryDirectory();
    targetDir += "/";
    targetDir += GetAutogenTargetName(target);
  }
  return targetDir;
}